

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O3

int mpt::find_item(void *ptr,identifier *id,convertable *conv,collection *sub)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  item_match tmp;
  
  uVar4 = 0;
  if ((id != (identifier *)0x0) &&
     (bVar2 = identifier::equal(id,*(char **)((long)ptr + 8),*(int *)((long)ptr + 0x10)), uVar4 = 0,
     bVar2)) {
    if (*(size_t *)((long)ptr + 0x18) == 0) {
      uVar4 = 1;
      if ((conv != (convertable *)0x0) &&
         ((*(long *)((long)ptr + 0x20) == 0 ||
          (iVar3 = (**conv->_vptr_convertable)(conv,*(long *)((long)ptr + 0x20),0), -1 < iVar3)))) {
        *(convertable **)ptr = conv;
        uVar4 = 0x101;
      }
    }
    else if (sub != (collection *)0x0) {
      memchr((void *)(*(long *)((long)ptr + 8) + *(long *)((long)ptr + 0x10) + 1),
             (int)*(char *)((long)ptr + 0x28),*(size_t *)((long)ptr + 0x18));
      uVar1 = *ptr;
      uVar4 = (**sub->_vptr_collection)(sub,find_item);
      if (-1 < (int)uVar4) {
        *(undefined8 *)ptr = uVar1;
        uVar4 = uVar4 | 2;
      }
    }
  }
  return uVar4;
}

Assistant:

static int find_item(void *ptr, const identifier *id, convertable *conv, const collection *sub)
{
	struct item_match *ctx = static_cast<item_match *>(ptr);
	if (!id) {
		return 0;
	}
	// identifier must match current element
	if (!id->equal(ctx->ident, ctx->curr)) {
		return 0;
	}
	// top level entry
	if (!ctx->left) {
		if (!conv) {
			return TraverseLeafs;
		}
		// check for type compatibility
		if (ctx->type) {
			if (conv->convert(ctx->type, 0) < 0) {
				return TraverseLeafs;
			}
		}
		ctx->conv = conv;
		return TraverseStop | TraverseLeafs;
	}
	// no nested data
	if (!sub) {
		return 0;
	}
	// advance to nested element name
	const char *next = ctx->ident + ctx->curr + 1;
	const char *sep = (char *) memchr(next, ctx->sep, ctx->left);
	struct item_match tmp = *ctx;
	if (sep) {
		tmp.curr = sep - next;
		tmp.left -= (tmp.curr + 1);
	} else {
		tmp.curr = tmp.left;
		tmp.left = 0;
	}
	tmp.ident = next;
	
	// find nested element
	int ret = sub->each(find_item, &tmp);
	if (ret < 0) {
		return ret;
	}
	ctx->conv = tmp.conv;
	ret |= TraverseNonLeafs;
	return ret;
}